

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread-posix.c
# Opt level: O1

PUThread *
p_uthread_create_internal
          (PUThreadFunc func,pboolean joinable,PUThreadPriority prio,psize stack_size)

{
  int iVar1;
  pboolean pVar2;
  PUThread *__arg;
  ulong uVar3;
  char *pcVar4;
  pint sched_policy;
  pint native_prio;
  sched_param sched;
  pthread_attr_t attr;
  int local_74;
  int local_70;
  sched_param local_6c;
  pthread_attr_t local_68;
  
  __arg = (PUThread *)p_malloc0(0x38);
  if (__arg == (PUThread *)0x0) {
    printf("** Error: %s **\n","PUThread::p_uthread_create_internal: failed to allocate memory");
    return (PUThread *)0x0;
  }
  (__arg->base).joinable = joinable;
  iVar1 = pthread_attr_init(&local_68);
  if (iVar1 != 0) {
    printf("** Error: %s **\n","PUThread::p_uthread_create_internal: pthread_attr_init() failed");
    goto LAB_0011658f;
  }
  iVar1 = pthread_attr_setdetachstate(&local_68,(uint)(joinable == 0));
  if (iVar1 == 0) {
    if (prio == P_UTHREAD_PRIORITY_INHERIT) {
      iVar1 = pthread_attr_setinheritsched(&local_68,0);
      if (iVar1 != 0) {
        pcVar4 = "PUThread::p_uthread_create_internal: pthread_attr_setinheritsched() failed";
        goto LAB_00116479;
      }
    }
    else {
      iVar1 = pthread_attr_getschedpolicy(&local_68,&local_74);
      if (iVar1 == 0) {
        pVar2 = pp_uthread_get_unix_priority(prio,&local_74,&local_70);
        if (pVar2 == 0) {
          pcVar4 = "PUThread::p_uthread_create_internal: pp_uthread_get_unix_priority() failed";
        }
        else {
          local_6c.__sched_priority = local_70;
          iVar1 = pthread_attr_setinheritsched(&local_68,1);
          pcVar4 = "PUThread::p_uthread_create_internal: failed to set priority";
          if (((iVar1 == 0) && (iVar1 = pthread_attr_setschedpolicy(&local_68,local_74), iVar1 == 0)
              ) && (iVar1 = pthread_attr_setschedparam(&local_68,&local_6c), iVar1 == 0))
          goto LAB_0011649b;
        }
      }
      else {
        pcVar4 = "PUThread::p_uthread_create_internal: pthread_attr_getschedpolicy() failed";
      }
LAB_00116479:
      printf("** Warning: %s **\n",pcVar4);
    }
LAB_0011649b:
    if (stack_size != 0) {
      uVar3 = sysconf(0x4b);
      if ((long)uVar3 < 1) {
        printf("** Warning: %s **\n",
               "PUThread::p_uthread_create_internal: sysconf() with _SC_THREAD_STACK_MIN failed");
      }
      else if (stack_size < uVar3) {
        stack_size = uVar3;
      }
      iVar1 = pthread_attr_setstacksize(&local_68,stack_size);
      if (iVar1 != 0) {
        printf("** Warning: %s **\n",
               "PUThread::p_uthread_create_internal: pthread_attr_setstacksize() failed");
      }
    }
    iVar1 = pthread_create(&__arg->hdl,&local_68,(__start_routine *)func,__arg);
    if (iVar1 == 1) {
      pthread_attr_setinheritsched(&local_68,0);
      iVar1 = pthread_create(&__arg->hdl,&local_68,(__start_routine *)func,__arg);
    }
    if (iVar1 == 0) {
      (__arg->base).prio = prio;
      pthread_attr_destroy(&local_68);
      return __arg;
    }
    pcVar4 = "PUThread::p_uthread_create_internal: pthread_create() failed";
  }
  else {
    pcVar4 = "PUThread::p_uthread_create_internal: pthread_attr_setdetachstate() failed";
  }
  printf("** Error: %s **\n",pcVar4);
  pthread_attr_destroy(&local_68);
LAB_0011658f:
  p_free(__arg);
  return (PUThread *)0x0;
}

Assistant:

PUThread *
p_uthread_create_internal (PUThreadFunc		func,
			   pboolean		joinable,
			   PUThreadPriority	prio,
			   psize		stack_size)
{
	PUThread		*ret;
	pthread_attr_t		attr;
	pint			create_code;
#ifdef PLIBSYS_HAS_POSIX_SCHEDULING
	struct sched_param	sched;
	pint			native_prio;
	pint			sched_policy;
#endif

#if defined (PLIBSYS_HAS_POSIX_STACKSIZE) && defined (_SC_THREAD_STACK_MIN)
	plong			min_stack;
#endif

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PUThread))) == NULL)) {
		P_ERROR ("PUThread::p_uthread_create_internal: failed to allocate memory");
		return NULL;
	}

	ret->base.joinable = joinable;

	if (P_UNLIKELY (pthread_attr_init (&attr) != 0)) {
		P_ERROR ("PUThread::p_uthread_create_internal: pthread_attr_init() failed");
		p_free (ret);
		return NULL;
	}

	if (P_UNLIKELY (pthread_attr_setdetachstate (&attr,
						     joinable ? PTHREAD_CREATE_JOINABLE
							      : PTHREAD_CREATE_DETACHED) != 0)) {
		P_ERROR ("PUThread::p_uthread_create_internal: pthread_attr_setdetachstate() failed");
		pthread_attr_destroy (&attr);
		p_free (ret);
		return NULL;
	}

#ifdef PLIBSYS_HAS_POSIX_SCHEDULING
	if (prio == P_UTHREAD_PRIORITY_INHERIT) {
		if (P_UNLIKELY (pthread_attr_setinheritsched (&attr, PTHREAD_INHERIT_SCHED) != 0))
			P_WARNING ("PUThread::p_uthread_create_internal: pthread_attr_setinheritsched() failed");
	} else {
		if (P_LIKELY (pthread_attr_getschedpolicy (&attr, &sched_policy) == 0)) {
			if (P_LIKELY (pp_uthread_get_unix_priority (prio,
								     &sched_policy,
								     &native_prio) == TRUE)) {
				memset (&sched, 0, sizeof (sched));
				sched.sched_priority = native_prio;

				if (P_LIKELY (pthread_attr_setinheritsched (&attr, PTHREAD_EXPLICIT_SCHED) != 0 ||
					      pthread_attr_setschedpolicy (&attr, sched_policy) != 0 ||
					      pthread_attr_setschedparam (&attr, &sched) != 0))
					P_WARNING ("PUThread::p_uthread_create_internal: failed to set priority");
			} else
				P_WARNING ("PUThread::p_uthread_create_internal: pp_uthread_get_unix_priority() failed");
		} else
			P_WARNING ("PUThread::p_uthread_create_internal: pthread_attr_getschedpolicy() failed");
	}
#endif

#ifdef PLIBSYS_HAS_POSIX_STACKSIZE
#  ifdef _SC_THREAD_STACK_MIN
	if (stack_size > 0) {
		min_stack = (plong) sysconf (_SC_THREAD_STACK_MIN);

		if (P_LIKELY (min_stack > 0)) {
			if (P_UNLIKELY (stack_size < (psize) min_stack))
				stack_size = (psize) min_stack;
		} else
			P_WARNING ("PUThread::p_uthread_create_internal: sysconf() with _SC_THREAD_STACK_MIN failed");

		if (P_UNLIKELY (pthread_attr_setstacksize (&attr, stack_size) != 0))
			P_WARNING ("PUThread::p_uthread_create_internal: pthread_attr_setstacksize() failed");
	}
#  endif
#endif

	create_code = pthread_create (&ret->hdl, &attr, func, ret);

#ifdef EPERM
	if (create_code == EPERM) {
#  ifdef PLIBSYS_HAS_POSIX_SCHEDULING
		pthread_attr_setinheritsched (&attr, PTHREAD_INHERIT_SCHED);
#  endif
		create_code = pthread_create (&ret->hdl, &attr, func, ret);
	}
#endif

	if (P_UNLIKELY (create_code != 0)) {
		P_ERROR ("PUThread::p_uthread_create_internal: pthread_create() failed");
		pthread_attr_destroy (&attr);
		p_free (ret);
		return NULL;
	}

	ret->base.prio = prio;
	pthread_attr_destroy (&attr);

	return ret;
}